

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

matrix<double> *
mat_lib::operator*(matrix<double> *__return_storage_ptr__,matrix<double> *a,matrix<double> *b)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  double *pdVar4;
  element_t *peVar5;
  ostream *poVar6;
  invalid_argument *this;
  element_t *peVar7;
  size_t sVar8;
  long lVar9;
  double *pdVar10;
  size_t sVar11;
  double *pdVar12;
  size_t sVar13;
  element_t eVar14;
  ostringstream str_stream;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  sVar1 = a->columns__;
  if (sVar1 == b->rows__) {
    sVar2 = a->rows__;
    sVar3 = b->columns__;
    (__return_storage_ptr__->super_base_matrix<double>).format__ = fixed;
    (__return_storage_ptr__->super_base_matrix<double>).fractional_digits__ = 6;
    __return_storage_ptr__->rows__ = sVar2;
    __return_storage_ptr__->columns__ = sVar3;
    peVar5 = (element_t *)operator_new__(-(ulong)(sVar3 * sVar2 >> 0x3d != 0) | sVar3 * sVar2 * 8);
    __return_storage_ptr__->elements__ = peVar5;
    if (sVar2 != 0) {
      peVar7 = a->elements__;
      pdVar4 = b->elements__;
      sVar8 = 0;
      do {
        if (sVar3 != 0) {
          lVar9 = sVar8 * sVar3;
          sVar11 = 0;
          pdVar10 = pdVar4;
          do {
            peVar5[lVar9 + sVar11] = 0.0;
            if (sVar1 != 0) {
              eVar14 = peVar5[lVar9 + sVar11];
              sVar13 = 0;
              pdVar12 = pdVar10;
              do {
                eVar14 = eVar14 + peVar7[sVar13] * *pdVar12;
                peVar5[lVar9 + sVar11] = eVar14;
                sVar13 = sVar13 + 1;
                pdVar12 = pdVar12 + sVar3;
              } while (sVar1 != sVar13);
            }
            sVar11 = sVar11 + 1;
            pdVar10 = pdVar10 + 1;
          } while (sVar11 != sVar3);
        }
        sVar8 = sVar8 + 1;
        peVar7 = peVar7 + sVar1;
      } while (sVar8 != sVar2);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"size mismatch! cannot multiple matrices (",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"operator*",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"() in ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x23f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,asStack_1c8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t columns() const { return columns__; }